

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Minisat::
OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
::clean(OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
        *this,int *idx)

{
  bool bVar1;
  vec<unsigned_int,_int> *this_00;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  this_00 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::operator[]
                      (&this->occs,*idx);
  lVar4 = 0;
  iVar6 = 0;
  for (lVar5 = 0; lVar5 < this_00->sz; lVar5 = lVar5 + 1) {
    bVar1 = SimpSolver::ClauseDeleted::operator()
                      (&this->deleted,(CRef *)((long)this_00->data + lVar4));
    if (!bVar1) {
      lVar3 = (long)iVar6;
      iVar6 = iVar6 + 1;
      this_00->data[lVar3] = this_00->data[lVar5];
    }
    lVar4 = lVar4 + 4;
  }
  vec<unsigned_int,_int>::shrink(this_00,(int)lVar5 - iVar6);
  pcVar2 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[](&this->dirty,*idx);
  *pcVar2 = '\0';
  return;
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}